

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall
CTcSymMetaclassBase::add_prop(CTcSymMetaclassBase *this,CTcSymProp *prop,int is_static)

{
  CTcSymMetaProp *this_00;
  int in_EDX;
  CTcSymProp *in_RSI;
  long in_RDI;
  CTcSymMetaProp *entry;
  CTcPrsMem *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  this_00 = (CTcSymMetaProp *)operator_new(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  CTcSymMetaProp::CTcSymMetaProp(this_00,in_RSI,in_EDX);
  if (*(long *)(in_RDI + 0x40) == 0) {
    *(CTcSymMetaProp **)(in_RDI + 0x38) = this_00;
  }
  else {
    *(CTcSymMetaProp **)(*(long *)(in_RDI + 0x40) + 8) = this_00;
  }
  *(CTcSymMetaProp **)(in_RDI + 0x40) = this_00;
  *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) + 1;
  return;
}

Assistant:

void CTcSymMetaclassBase::add_prop(class CTcSymProp *prop, int is_static)
{
    /* create a new list entry for the property */
    CTcSymMetaProp *entry = new (G_prsmem) CTcSymMetaProp(prop, is_static);
    
    /* link it at the end of our list */
    if (prop_tail_ != 0)
        prop_tail_->nxt_ = entry;
    else
        prop_head_ = entry;
    prop_tail_ = entry;

    /* count the addition */
    ++prop_cnt_;
}